

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall cmMakefileTargetGenerator::WriteCommonCodeRules(cmMakefileTargetGenerator *this)

{
  cmMakefile *this_00;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string *psVar4;
  cmGeneratedFileStream *this_01;
  string local_320;
  uint local_2fc;
  undefined1 local_2f8 [8];
  cmGeneratedFileStream depFileStream;
  string local_90;
  undefined1 local_70 [8];
  string dependFileNameFull;
  allocator local_39;
  string local_38;
  char *local_18;
  char *root;
  cmMakefileTargetGenerator *this_local;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  root = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_MAKE_INCLUDE_FROM_ROOT",&local_39);
  bVar1 = cmMakefile::IsOn(this_00,&local_38);
  local_18 = "";
  if (bVar1) {
    local_18 = "$(CMAKE_BINARY_DIR)/";
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::string((string *)local_70,(string *)&this->TargetBuildDirectoryFull);
  std::__cxx11::string::operator+=((string *)local_70,"/depend.make");
  poVar2 = std::operator<<((ostream *)this->BuildFileStream,
                           "# Include any dependencies generated for this target.\n");
  poVar2 = std::operator<<(poVar2,(string *)&this->GlobalGenerator->IncludeDirective);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,local_18);
  cmCommonTargetGenerator::Convert
            (&local_90,&this->super_cmCommonTargetGenerator,(string *)local_70,HOME_OUTPUT,MAKERULE)
  ;
  poVar2 = std::operator<<(poVar2,(string *)&local_90);
  std::operator<<(poVar2,"\n\n");
  std::__cxx11::string::~string((string *)&local_90);
  if ((this->NoRuleMessages & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)this->BuildFileStream,
                             "# Include the progress variables for this target.\n");
    poVar2 = std::operator<<(poVar2,(string *)&this->GlobalGenerator->IncludeDirective);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,local_18);
    cmCommonTargetGenerator::Convert
              ((string *)&depFileStream.field_0x240,&this->super_cmCommonTargetGenerator,
               &this->ProgressFileNameFull,HOME_OUTPUT,MAKERULE);
    poVar2 = std::operator<<(poVar2,(string *)&depFileStream.field_0x240);
    std::operator<<(poVar2,"\n\n");
    std::__cxx11::string::~string((string *)&depFileStream.field_0x240);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar3);
  if (!bVar1) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_2f8,pcVar3,false);
    poVar2 = std::operator<<((ostream *)local_2f8,"# Empty dependencies file for ");
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    poVar2 = std::operator<<(poVar2,(string *)psVar4);
    poVar2 = std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(poVar2,"# This may be replaced when dependencies are built.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2f8);
  }
  std::__cxx11::string::operator=
            ((string *)&this->FlagFileNameFull,(string *)&this->TargetBuildDirectoryFull);
  std::__cxx11::string::operator+=((string *)&this->FlagFileNameFull,"/flags.make");
  this_01 = (cmGeneratedFileStream *)operator_new(0x248);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream(this_01,pcVar3,false);
  this->FlagFileStream = this_01;
  cmGeneratedFileStream::SetCopyIfDifferent(this->FlagFileStream,true);
  bVar1 = this->FlagFileStream != (cmGeneratedFileStream *)0x0;
  if (bVar1) {
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              (this->LocalGenerator,(ostream *)this->FlagFileStream);
    poVar2 = std::operator<<((ostream *)this->BuildFileStream,
                             "# Include the compile flags for this target\'s objects.\n");
    poVar2 = std::operator<<(poVar2,(string *)&this->GlobalGenerator->IncludeDirective);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,local_18);
    cmCommonTargetGenerator::Convert
              (&local_320,&this->super_cmCommonTargetGenerator,&this->FlagFileNameFull,HOME_OUTPUT,
               MAKERULE);
    poVar2 = std::operator<<(poVar2,(string *)&local_320);
    std::operator<<(poVar2,"\n\n");
    std::__cxx11::string::~string((string *)&local_320);
  }
  local_2fc = (uint)!bVar1;
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteCommonCodeRules()
{
  const char* root = (this->Makefile->IsOn("CMAKE_MAKE_INCLUDE_FROM_ROOT")?
                      "$(CMAKE_BINARY_DIR)/" : "");

  // Include the dependencies for the target.
  std::string dependFileNameFull = this->TargetBuildDirectoryFull;
  dependFileNameFull += "/depend.make";
  *this->BuildFileStream
    << "# Include any dependencies generated for this target.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << this->Convert(dependFileNameFull,
                     cmLocalGenerator::HOME_OUTPUT,
                     cmLocalGenerator::MAKERULE)
    << "\n\n";

  if(!this->NoRuleMessages)
    {
    // Include the progress variables for the target.
    *this->BuildFileStream
      << "# Include the progress variables for this target.\n"
      << this->GlobalGenerator->IncludeDirective << " " << root
      << this->Convert(this->ProgressFileNameFull,
                       cmLocalGenerator::HOME_OUTPUT,
                       cmLocalGenerator::MAKERULE)
      << "\n\n";
    }

  // make sure the depend file exists
  if (!cmSystemTools::FileExists(dependFileNameFull.c_str()))
    {
    // Write an empty dependency file.
    cmGeneratedFileStream depFileStream(dependFileNameFull.c_str());
    depFileStream
      << "# Empty dependencies file for "
      << this->GeneratorTarget->GetName() << ".\n"
      << "# This may be replaced when dependencies are built." << std::endl;
    }

  // Open the flags file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  this->FlagFileNameFull = this->TargetBuildDirectoryFull;
  this->FlagFileNameFull += "/flags.make";
  this->FlagFileStream =
    new cmGeneratedFileStream(this->FlagFileNameFull.c_str());
  this->FlagFileStream->SetCopyIfDifferent(true);
  if(!this->FlagFileStream)
    {
    return;
    }
  this->LocalGenerator->WriteDisclaimer(*this->FlagFileStream);

  // Include the flags for the target.
  *this->BuildFileStream
    << "# Include the compile flags for this target's objects.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << this->Convert(this->FlagFileNameFull,
                                     cmLocalGenerator::HOME_OUTPUT,
                                     cmLocalGenerator::MAKERULE)
    << "\n\n";
}